

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_SecureChannelManager_init(UA_SecureChannelManager *cm,UA_Server *server)

{
  UA_Server *server_local;
  UA_SecureChannelManager *cm_local;
  
  (cm->channels).lh_first = (channel_list_entry *)0x0;
  cm->lastChannelId = 1;
  cm->lastTokenId = 1;
  cm->currentChannelCount = 0;
  cm->server = server;
  return 0;
}

Assistant:

UA_StatusCode
UA_SecureChannelManager_init(UA_SecureChannelManager *cm, UA_Server *server) {
    LIST_INIT(&cm->channels);
    cm->lastChannelId = STARTCHANNELID;
    cm->lastTokenId = STARTTOKENID;
    cm->currentChannelCount = 0;
    cm->server = server;
    return UA_STATUSCODE_GOOD;
}